

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::operator<(Value *this,Value *other)

{
  int iVar1;
  uint *puVar2;
  size_type sVar3;
  size_type sVar4;
  int delta;
  int comp;
  allocator<char> local_69;
  string local_68;
  uint local_44;
  char *pcStack_40;
  uint min_len;
  char *other_str;
  char *this_str;
  uint local_28;
  uint other_len;
  uint this_len;
  int typeDelta;
  Value *other_local;
  Value *this_local;
  
  other_len = (uint)(*(ushort *)&this->field_0x8 & 0xff) -
              (uint)(*(ushort *)&other->field_0x8 & 0xff);
  if (other_len == 0) {
    _this_len = other;
    other_local = this;
    switch(this->field_0x8) {
    case 0:
      this_local._7_1_ = false;
      break;
    case 1:
      this_local._7_1_ = (this->value_).int_ < (other->value_).int_;
      break;
    case 2:
      this_local._7_1_ = (this->value_).uint_ < (other->value_).uint_;
      break;
    case 3:
      this_local._7_1_ = (this->value_).real_ < (other->value_).real_;
      break;
    case 4:
      if (((this->value_).int_ == 0) || ((other->value_).int_ == 0)) {
        if ((other->value_).int_ == 0) {
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
      else {
        decodePrefixedString
                  ((*(ushort *)&this->field_0x8 >> 8 & 1) != 0,(this->value_).string_,&local_28,
                   &other_str);
        decodePrefixedString
                  ((*(ushort *)&_this_len->field_0x8 >> 8 & 1) != 0,(_this_len->value_).string_,
                   (uint *)((long)&this_str + 4),&stack0xffffffffffffffc0);
        puVar2 = std::min<unsigned_int>(&local_28,(uint *)((long)&this_str + 4));
        local_44 = *puVar2;
        if ((other_str == (char *)0x0) || (pcStack_40 == (char *)0x0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68,"assert json failed",&local_69);
          throwLogicError(&local_68);
        }
        iVar1 = memcmp(other_str,pcStack_40,(ulong)local_44);
        if (iVar1 < 0) {
          this_local._7_1_ = true;
        }
        else if (iVar1 < 1) {
          this_local._7_1_ = local_28 < this_str._4_4_;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      break;
    case 5:
      this_local._7_1_ = ((this->value_).bool_ & 1U) < ((other->value_).bool_ & 1U);
      break;
    case 6:
    case 7:
      sVar3 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::size((this->value_).map_);
      sVar4 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::size((_this_len->value_).map_);
      if ((int)sVar3 == (int)sVar4) {
        this_local._7_1_ = std::operator<((this->value_).map_,(_this_len->value_).map_);
      }
      else {
        this_local._7_1_ = (int)sVar3 - (int)sVar4 < 0;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                    ,0x260,"bool Json::Value::operator<(const Value &) const");
    }
  }
  else {
    this_local._7_1_ = (bool)((byte)((int)other_len >> 0x1f) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool Value::operator<(const Value& other) const {
  int typeDelta = type_ - other.type_;
  if (typeDelta)
    return typeDelta < 0 ? true : false;
  switch (type_) {
  case nullValue:
    return false;
  case intValue:
    return value_.int_ < other.value_.int_;
  case uintValue:
    return value_.uint_ < other.value_.uint_;
  case realValue:
    return value_.real_ < other.value_.real_;
  case booleanValue:
    return value_.bool_ < other.value_.bool_;
  case stringValue:
  {
    if ((value_.string_ == 0) || (other.value_.string_ == 0)) {
      if (other.value_.string_) return true;
      else return false;
    }
    unsigned this_len;
    unsigned other_len;
    char const* this_str;
    char const* other_str;
    decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
    decodePrefixedString(other.allocated_, other.value_.string_, &other_len, &other_str);
    unsigned min_len = std::min<unsigned>(this_len, other_len);
    JSON_ASSERT(this_str && other_str);
    int comp = memcmp(this_str, other_str, min_len);
    if (comp < 0) return true;
    if (comp > 0) return false;
    return (this_len < other_len);
  }
  case arrayValue:
  case objectValue: {
    int delta = int(value_.map_->size() - other.value_.map_->size());
    if (delta)
      return delta < 0;
    return (*value_.map_) < (*other.value_.map_);
  }
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  return false; // unreachable
}